

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O2

void Ver_ParsePrintLog(Ver_Man_t *pMan)

{
  int *piVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Obj_t *p;
  int iVar3;
  char *pcVar4;
  FILE *__stream;
  void *pvVar5;
  Abc_Ntk_t *pAVar6;
  Abc_Obj_t *pAVar7;
  char *pcVar8;
  int iVar9;
  uint uVar10;
  Vec_Ptr_t *pVVar11;
  int iVar12;
  int i;
  char Buffer [1000];
  
  pcVar4 = Extra_FileNameGeneric(pMan->pFileName);
  iVar9 = 0;
  sprintf(Buffer,"%s.log",pcVar4);
  free(pcVar4);
  __stream = fopen(Buffer,"w");
  while( true ) {
    pVVar11 = pMan->pDesign->vModules;
    iVar12 = pVVar11->nSize;
    if (iVar12 <= iVar9) break;
    pvVar5 = Vec_PtrEntry(pVVar11,iVar9);
    *(undefined4 *)((long)pvVar5 + 0xc0) = 0;
    iVar9 = iVar9 + 1;
  }
  for (iVar9 = 0; iVar9 < iVar12; iVar9 = iVar9 + 1) {
    pAVar6 = (Abc_Ntk_t *)Vec_PtrEntry(pVVar11,iVar9);
    for (iVar12 = 0; iVar12 < pAVar6->vBoxes->nSize; iVar12 = iVar12 + 1) {
      pAVar7 = Abc_NtkBox(pAVar6,iVar12);
      if (((*(uint *)&pAVar7->field_0x14 & 0xf) != 8) && ((pAVar7->field_5).pData != (void *)0x0)) {
        piVar1 = (int *)((long)(pAVar7->field_5).pData + 0xc0);
        *piVar1 = *piVar1 + 1;
      }
    }
    pVVar11 = pMan->pDesign->vModules;
    iVar12 = pVVar11->nSize;
  }
  fprintf(__stream,"The hierarhical design %s contains %d modules:\n",pMan->pFileName);
  iVar9 = 0;
  uVar10 = 0;
  while( true ) {
    pVVar11 = pMan->pDesign->vModules;
    iVar12 = pVVar11->nSize;
    if (iVar12 <= iVar9) break;
    pAVar6 = (Abc_Ntk_t *)Vec_PtrEntry(pVVar11,iVar9);
    fprintf(__stream,"%-50s : ",pAVar6->pName);
    iVar12 = Ver_NtkIsDefined(pAVar6);
    pcVar4 = "undefbox";
    if ((iVar12 != 0) && (pcVar4 = "logicbox", pAVar6->ntkFunc == ABC_FUNC_BLACKBOX)) {
      pcVar4 = "blackbox";
    }
    fwrite(pcVar4,8,1,__stream);
    fprintf(__stream," instantiated %6d times ",(ulong)(uint)pAVar6->fHieVisited);
    fprintf(__stream," pi = %4d",(ulong)(uint)pAVar6->vPis->nSize);
    fprintf(__stream," po = %4d",(ulong)(uint)pAVar6->vPos->nSize);
    fprintf(__stream," nd = %8d",(ulong)(uint)pAVar6->nObjCounts[7]);
    fprintf(__stream," lat = %6d",(ulong)(uint)pAVar6->nObjCounts[8]);
    fprintf(__stream," box = %6d",(ulong)(uint)(pAVar6->vBoxes->nSize - pAVar6->nObjCounts[8]));
    fputc(10,__stream);
    uVar10 = uVar10 + (pAVar6->vPos->nSize == 1);
    iVar9 = iVar9 + 1;
  }
  for (iVar9 = 0; iVar9 < iVar12; iVar9 = iVar9 + 1) {
    pvVar5 = Vec_PtrEntry(pVVar11,iVar9);
    *(undefined4 *)((long)pvVar5 + 0xc0) = 0;
    pVVar11 = pMan->pDesign->vModules;
    iVar12 = pVVar11->nSize;
  }
  fprintf(__stream,"The number of modules with one output = %d (%.2f %%).\n",
          ((double)(int)uVar10 * 100.0) / (double)iVar12,(ulong)uVar10);
  pVVar11 = pMan->pDesign->vModules;
  iVar9 = pVVar11->nSize;
  if (1 < iVar9) {
    uVar10 = 0;
    for (iVar12 = 0; iVar12 < iVar9; iVar12 = iVar12 + 1) {
      pAVar6 = (Abc_Ntk_t *)Vec_PtrEntry(pVVar11,iVar12);
      for (iVar9 = 0; iVar9 < pAVar6->vBoxes->nSize; iVar9 = iVar9 + 1) {
        pAVar7 = Abc_NtkBox(pAVar6,iVar9);
        if (((*(uint *)&pAVar7->field_0x14 & 0xf) != 8) &&
           (pAVar2 = (Abc_Ntk_t *)(pAVar7->field_5).pData, pAVar2 != (Abc_Ntk_t *)0x0)) {
          pAVar7 = (pAVar7->field_6).pCopy;
          iVar3 = Ver_NtkIsDefined(pAVar2);
          if (iVar3 != 0) {
            iVar3 = 0;
            for (i = 0; i < *(int *)((long)&pAVar7->pNtk + 4); i = i + 1) {
              pvVar5 = Vec_PtrEntry((Vec_Ptr_t *)pAVar7,i);
              iVar3 = iVar3 + *(int *)(*(long *)((long)pvVar5 + 8) + 4);
            }
            uVar10 = uVar10 + (iVar3 != pAVar2->vPos->nSize + pAVar2->vPis->nSize);
          }
        }
      }
      pVVar11 = pMan->pDesign->vModules;
      iVar9 = pVVar11->nSize;
    }
    if (uVar10 == 0) {
      fwrite("The outputs of all box instances are connected.\n",0x30,1,__stream);
    }
    else {
      fputc(10,__stream);
      fprintf(__stream,"The outputs of %d box instances are not connected:\n",(ulong)uVar10);
      for (iVar9 = 0; pVVar11 = pMan->pDesign->vModules, iVar9 < pVVar11->nSize; iVar9 = iVar9 + 1)
      {
        pAVar6 = (Abc_Ntk_t *)Vec_PtrEntry(pVVar11,iVar9);
        for (iVar12 = 0; iVar12 < pAVar6->vBoxes->nSize; iVar12 = iVar12 + 1) {
          pAVar7 = Abc_NtkBox(pAVar6,iVar12);
          if (((*(uint *)&pAVar7->field_0x14 & 0xf) != 8) &&
             (pAVar2 = (Abc_Ntk_t *)(pAVar7->field_5).pData, pAVar2 != (Abc_Ntk_t *)0x0)) {
            p = (pAVar7->field_6).pCopy;
            iVar3 = Ver_NtkIsDefined(pAVar2);
            if (iVar3 != 0) {
              uVar10 = 0;
              for (iVar3 = 0; iVar3 < *(int *)((long)&p->pNtk + 4); iVar3 = iVar3 + 1) {
                pvVar5 = Vec_PtrEntry((Vec_Ptr_t *)p,iVar3);
                uVar10 = uVar10 + *(int *)(*(long *)((long)pvVar5 + 8) + 4);
              }
              if (uVar10 != pAVar2->vPos->nSize + pAVar2->vPis->nSize) {
                pcVar4 = pAVar6->pName;
                pcVar8 = Abc_ObjName(pAVar7);
                fprintf(__stream,
                        "In module \"%s\" instance \"%s\" of box \"%s\" has different numbers of actual/formal nets (%d/%d).\n"
                        ,pcVar4,pcVar8,pAVar2->pName,(ulong)uVar10,
                        pAVar2->vPos->nSize + pAVar2->vPis->nSize);
              }
            }
          }
        }
      }
    }
  }
  fclose(__stream);
  printf("Hierarchy statistics can be found in log file \"%s\".\n",Buffer);
  return;
}

Assistant:

void Ver_ParsePrintLog( Ver_Man_t * pMan )
{
    Abc_Ntk_t * pNtk, * pNtkBox;
    Abc_Obj_t * pBox;
    FILE * pFile;
    char * pNameGeneric;
    char Buffer[1000];
    int i, k, Count1 = 0;

    // open the log file
    pNameGeneric = Extra_FileNameGeneric( pMan->pFileName );
    sprintf( Buffer, "%s.log", pNameGeneric );
    ABC_FREE( pNameGeneric );
    pFile = fopen( Buffer, "w" );

    // count the total number of instances and how many times they occur
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
        pNtk->fHieVisited = 0;
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
        Abc_NtkForEachBox( pNtk, pBox, k )
        {
            if ( Abc_ObjIsLatch(pBox) )
                continue;
            pNtkBox = (Abc_Ntk_t *)pBox->pData;
            if ( pNtkBox == NULL )
                continue;
            pNtkBox->fHieVisited++;
        }